

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SENodeSimplifyImpl::AccumulatorsFromMultiply
          (SENodeSimplifyImpl *this,SENode *multiply,bool negation)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ChildContainerType *this_00;
  size_type sVar4;
  SEConstantNode *this_01;
  int64_t iVar5;
  reference ppVar6;
  pair<spvtools::opt::SENode_*const,_long> local_78;
  _Self local_68;
  long local_60;
  int64_t new_value;
  iterator iterator;
  int64_t sign;
  SENode *constant;
  SENode *value_unknown;
  SENode *operand_2;
  SENode *operand_1;
  SENode *pSStack_20;
  bool negation_local;
  SENode *multiply_local;
  SENodeSimplifyImpl *this_local;
  
  operand_1._7_1_ = negation;
  pSStack_20 = multiply;
  multiply_local = (SENode *)this;
  this_00 = SENode::GetChildren(multiply);
  sVar4 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                    (this_00);
  if ((sVar4 == 2) && (iVar3 = (**pSStack_20->_vptr_SENode)(), iVar3 == 3)) {
    operand_2 = SENode::GetChild(pSStack_20,0);
    value_unknown = SENode::GetChild(pSStack_20,1);
    constant = (SENode *)0x0;
    sign = 0;
    iVar3 = (**operand_2->_vptr_SENode)();
    if ((iVar3 == 5) || (iVar3 = (**operand_2->_vptr_SENode)(), iVar3 == 1)) {
      constant = operand_2;
    }
    else {
      iVar3 = (**value_unknown->_vptr_SENode)();
      if ((iVar3 == 5) || (iVar3 = (**value_unknown->_vptr_SENode)(), iVar3 == 1)) {
        constant = value_unknown;
      }
    }
    iVar3 = (**operand_2->_vptr_SENode)();
    if (iVar3 == 0) {
      sign = (int64_t)operand_2;
    }
    else {
      iVar3 = (**value_unknown->_vptr_SENode)();
      if (iVar3 == 0) {
        sign = (int64_t)value_unknown;
      }
    }
    if ((constant == (SENode *)0x0) || (sign == 0)) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = 1;
      if ((operand_1._7_1_ & 1) != 0) {
        iVar3 = -1;
      }
      iterator._M_node = (_Base_ptr)(long)iVar3;
      new_value = (int64_t)std::
                           map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
                           ::find(&this->accumulators_,&constant);
      this_01 = (SEConstantNode *)(**(code **)(*(long *)sign + 0x20))();
      iVar5 = SEConstantNode::FoldToSingleValue(this_01);
      local_60 = iVar5 * (long)iterator._M_node;
      local_68._M_node =
           (_Base_ptr)
           std::
           map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
           ::end(&this->accumulators_);
      bVar2 = std::operator!=((_Self *)&new_value,&local_68);
      lVar1 = local_60;
      if (bVar2) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<spvtools::opt::SENode_*const,_long>_>::operator*
                           ((_Rb_tree_iterator<std::pair<spvtools::opt::SENode_*const,_long>_> *)
                            &new_value);
        ppVar6->second = lVar1 + ppVar6->second;
      }
      else {
        std::pair<spvtools::opt::SENode_*const,_long>::pair<spvtools::opt::SENode_*&,_long_&,_true>
                  (&local_78,&constant,&local_60);
        std::
        map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
        ::insert(&this->accumulators_,&local_78);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SENodeSimplifyImpl::AccumulatorsFromMultiply(SENode* multiply,
                                                  bool negation) {
  if (multiply->GetChildren().size() != 2 ||
      multiply->GetType() != SENode::Multiply)
    return false;

  SENode* operand_1 = multiply->GetChild(0);
  SENode* operand_2 = multiply->GetChild(1);

  SENode* value_unknown = nullptr;
  SENode* constant = nullptr;

  // Work out which operand is the unknown value.
  if (operand_1->GetType() == SENode::ValueUnknown ||
      operand_1->GetType() == SENode::RecurrentAddExpr)
    value_unknown = operand_1;
  else if (operand_2->GetType() == SENode::ValueUnknown ||
           operand_2->GetType() == SENode::RecurrentAddExpr)
    value_unknown = operand_2;

  // Work out which operand is the constant coefficient.
  if (operand_1->GetType() == SENode::Constant)
    constant = operand_1;
  else if (operand_2->GetType() == SENode::Constant)
    constant = operand_2;

  // If the expression is not a variable multiplied by a constant coefficient,
  // exit out.
  if (!(value_unknown && constant)) {
    return false;
  }

  int64_t sign = negation ? -1 : 1;

  auto iterator = accumulators_.find(value_unknown);
  int64_t new_value = constant->AsSEConstantNode()->FoldToSingleValue() * sign;
  // Add the result of the multiplication to the accumulators.
  if (iterator != accumulators_.end()) {
    (*iterator).second += new_value;
  } else {
    accumulators_.insert({value_unknown, new_value});
  }

  return true;
}